

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
           *this,_func_Boxed_Value_Function_Params_ptr *t_f,int t_arity,
          shared_ptr<chaiscript::AST_Node> *t_parsenode,Param_Types *t_param_types,
          Proxy_Function *t_guard)

{
  Proxy_Function local_58;
  shared_ptr<chaiscript::AST_Node> local_48;
  Param_Types local_38;
  
  local_48.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_parsenode->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_38.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.m_types.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (t_param_types->m_types).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (t_param_types->m_types).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.m_has_types = t_param_types->m_has_types;
  local_58.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (t_guard->
            super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            )._M_ptr;
  local_58.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (t_guard->
       super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  (t_guard->
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (t_guard->
  super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       = (element_type *)0x0;
  Dynamic_Proxy_Function::Dynamic_Proxy_Function
            (&this->super_Dynamic_Proxy_Function,t_arity,&local_48,&local_38,&local_58);
  if (local_58.
      super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&local_38.m_types);
  if (local_48.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Proxy_Function_003d8a98;
  this->m_f = t_f;
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(Callable t_f,
                                  int t_arity = -1,
                                  std::shared_ptr<AST_Node> t_parsenode = AST_NodePtr(),
                                  Param_Types t_param_types = Param_Types(),
                                  Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(t_arity, std::move(t_parsenode), std::move(t_param_types), std::move(t_guard))
          , m_f(std::move(t_f)) {
      }